

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall MlmWrap::addSubToList(MlmWrap *this,HighFreqSub *newSub)

{
  HighFreqSub *local_8;
  
  local_8 = newSub;
  std::vector<HighFreqSub_*,_std::allocator<HighFreqSub_*>_>::push_back(&this->hfSubs,&local_8);
  return 0;
}

Assistant:

int MlmWrap::addSubToList(HighFreqSub *newSub) {
    hfSubs.push_back(newSub);
    //todo: possibly check for duplicates?
    return(0);
}